

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

uint32_t hash_string_obj(ObjString *string)

{
  uint32_t uVar1;
  
  if (string->hashed == true) {
    uVar1 = string->hash;
  }
  else {
    uVar1 = hash_string(string->start,string->length);
    string->hash = uVar1;
    string->hashed = true;
  }
  return uVar1;
}

Assistant:

uint32_t hash_string_obj(ObjString *string) {
    if (string->hashed) {
        return string->hash;
    }

    uint32_t hash = hash_string(string->start, string->length);

    string->hash = hash;
    string->hashed = true;

    return hash;
}